

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O0

int createOrUpdateOption(HTTPAPIEX_HANDLE_DATA *handleData,char *optionName,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  HTTPAPIEX_SAVED_OPTION newOption;
  HTTPAPIEX_SAVED_OPTION *whereIsIt;
  int result;
  void *value_local;
  char *optionName_local;
  HTTPAPIEX_HANDLE_DATA *handleData_local;
  
  newOption.value = VECTOR_find_if(handleData->savedOptions,sameName,optionName);
  if (newOption.value == (void *)0x0) {
    iVar1 = mallocAndStrcpy_s((char **)&l,optionName);
    if (iVar1 == 0) {
      newOption.optionName = (char *)value;
      iVar1 = VECTOR_push_back(handleData->savedOptions,&l,1);
      if (iVar1 == 0) {
        whereIsIt._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/httpapiex.c"
                    ,"createOrUpdateOption",0x28d,1,"unable to VECTOR_push_back");
        }
        free(l);
        free(value);
        whereIsIt._4_4_ = 0x290;
      }
    }
    else {
      free(value);
      whereIsIt._4_4_ = 0x286;
    }
  }
  else {
    free(*(void **)((long)newOption.value + 8));
    *(void **)((long)newOption.value + 8) = value;
    whereIsIt._4_4_ = 0;
  }
  return whereIsIt._4_4_;
}

Assistant:

static int createOrUpdateOption(HTTPAPIEX_HANDLE_DATA* handleData, const char* optionName, const void* value)
{
    /*this function is called after the option value has been saved (cloned)*/
    int result;

    /*decide bwtween update or create*/
    HTTPAPIEX_SAVED_OPTION* whereIsIt = (HTTPAPIEX_SAVED_OPTION*)VECTOR_find_if(handleData->savedOptions, sameName, optionName);
    if (whereIsIt != NULL)
    {
        free((void*)(whereIsIt->value));
        whereIsIt->value = value;
        result = 0;
    }
    else
    {
        HTTPAPIEX_SAVED_OPTION newOption;
        if (mallocAndStrcpy_s((char**)&(newOption.optionName), optionName) != 0)
        {
            free((void*)value);
            result = MU_FAILURE;
        }
        else
        {
            newOption.value = value;
            if (VECTOR_push_back(handleData->savedOptions, &newOption, 1) != 0)
            {
                LogError("unable to VECTOR_push_back");
                free((void*)newOption.optionName);
                free((void*)value);
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
    }

    return result;
}